

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal
          (ChElementBeamTaperedTimoshenko *this,ChMatrixRef *H,double Kfactor,double Rfactor,
          double Mfactor)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  variable_if_dynamic<long,__1> vVar17;
  DstXprType *pDVar18;
  element_type *peVar19;
  element_type *peVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  SrcEvaluatorType *pSVar22;
  assign_op<double,_double> *paVar23;
  pointer psVar24;
  element_type *peVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  ChMatrixDynamic<> *pCVar27;
  undefined1 auVar28 [64];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  CVar29;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  CVar30;
  int iVar31;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRVar32;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRVar33;
  double *pdVar34;
  char *pcVar35;
  long lVar36;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRVar37;
  long lVar38;
  double *pdVar39;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRVar40;
  ChMatrixDynamic<> *pCVar41;
  undefined1 *puVar42;
  long lVar43;
  ulong uVar44;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRVar45;
  long lVar46;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChMatrixDynamic<> CKCt;
  ChMatrixDynamic<> CRCt;
  ChMatrixDynamic<> CK;
  ActualDstType actualDst;
  ChMatrixDynamic<> CR;
  SrcEvaluatorType srcEvaluator;
  ChVectorDynamic<> displ;
  DstEvaluatorType dstEvaluator_2;
  ChMatrix33<double> AtolocwelB;
  ChVector<double> mXacc_B;
  ChVector<double> mXacc_A;
  ChVector<double> mWacc_A;
  ChVector<double> mWvel_A;
  ChQuaternion<double> q;
  DstEvaluatorType dstEvaluator;
  ChVector<double> mWvel_B;
  ChMatrix33<double> Atoabs;
  ChVector<double> mWacc_B;
  ChMatrix33<double> AtolocwelA;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_e40;
  DenseStorage<double,__1,__1,__1,_1> local_e20;
  undefined1 local_e01 [25];
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_de8;
  DenseStorage<double,__1,__1,__1,_1> local_de0;
  DenseStorage<double,__1,__1,__1,_1> local_dc0;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_da8;
  DenseStorage<double,__1,__1,__1,_1> local_da0;
  ChMatrix33<double> local_d88;
  undefined8 local_d38;
  ChMatrix33<double> local_d30;
  undefined1 local_ce8 [8];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_ce0;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_cc0;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined8 local_c48;
  ChMatrixRef local_c40;
  ChMatrixRef local_c00;
  ChMatrixRef local_bc0;
  ChMatrixRef local_b80;
  ChMatrixRef local_b40;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_b10;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRStack_b08;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [24];
  undefined1 local_ad8 [24];
  undefined1 local_ac0 [16];
  scalar_constant_op<double> sStack_ab0;
  scalar_constant_op<double> sStack_aa8;
  ChMatrixDynamic<> *pCStack_aa0;
  Matrix<double,__1,__1,_1,__1,__1> MStack_a98;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_a80;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRStack_a78;
  undefined1 auStack_a70 [48];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [56];
  double dStack_648;
  undefined1 local_640 [16];
  variable_if_dynamic<long,__1> vStack_630;
  undefined1 auStack_628 [104];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1a0 [24];
  ChMatrix33<double> local_188;
  undefined1 local_140 [24];
  ChMatrix33<double> local_128;
  ChMatrixRef local_e0;
  ChMatrixRef local_a0 [2];
  
  CVar29 = _local_640;
  local_e01._17_8_ = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0xc) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0xc)) {
    __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x338,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x339,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_da8 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)H;
  if ((((Kfactor == 0.0) && (!NAN(Kfactor))) && (Rfactor == 0.0)) && (!NAN(Rfactor))) {
    local_ac0._8_8_ = &local_d88;
    local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_ac0._0_8_ = local_640;
    local_640._0_8_ =
         (LhsNested)
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    CVar30 = _local_640;
    auStack_628._0_40_ = CVar29._24_40_;
    local_640 = CVar30._0_16_;
    vStack_630.m_value =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    sStack_ab0.m_other = (double)&local_d30;
    sStack_aa8.m_other = (double)H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_ac0);
LAB_0068447c:
    if (((double)local_e01._17_8_ == 0.0) && (!NAN((double)local_e01._17_8_))) {
      return;
    }
    local_e20.m_data = (double *)0x0;
    local_e20.m_rows = 0;
    local_e20.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_e20,0x90,0xc,0xc);
    local_ac0._0_8_ = local_e20.m_rows;
    local_ac0._8_8_ = local_e20.m_cols;
    sStack_ab0.m_other = 0.0;
    if ((local_e20.m_cols | local_e20.m_rows) < 0) {
      pcVar35 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_0068510d;
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_e20,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_ac0,(assign_op<double,_double> *)local_640);
    if (((this->tapered_section).
         super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->use_lumped_mass_matrix == true) {
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_b10 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                     *)((this->super_ChElementBeam).length * 0.5 * (double)local_e01._17_8_);
        local_e01._1_8_ = &this->M;
        pCVar41 = (ChMatrixDynamic<> *)0x18;
        lVar46 = 0;
        uVar44 = 0;
        uStack_af8 = 0;
        pRStack_b08 = local_b10;
        local_b00 = local_b10;
        do {
          pCVar27 = (ChMatrixDynamic<> *)(uVar44 * 6);
          lVar38 = uVar44 * 6 + 3;
          if (((((this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows < lVar38) ||
               (lVar36 = (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                         m_storage.m_cols, lVar36 < lVar38)) || (local_e20.m_rows < lVar38)) ||
             (local_e20.m_cols < lVar38)) {
LAB_00684f6c:
            pcVar35 = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
            ;
LAB_00684f81:
            __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar35);
          }
          pdVar34 = (double *)
                    ((long)(this->M).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data + (lVar36 + 1) * lVar46 + 0x10);
          pdVar39 = (double *)
                    ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_data)->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                           m_data.array +
                    (long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_cols)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                 m_storage.m_data.array + 1) * lVar46 + 0x10);
          lVar43 = 3;
          do {
            dVar2 = pdVar34[-1];
            pdVar39[-2] = (double)local_b10 * pdVar34[-2] + pdVar39[-2];
            pdVar39[-1] = (double)pRStack_b08 * dVar2 + pdVar39[-1];
            *pdVar39 = (double)local_b00 * *pdVar34 + *pdVar39;
            pdVar34 = pdVar34 + lVar36;
            pdVar39 = pdVar39 + local_e20.m_cols;
            lVar43 = lVar43 + -1;
          } while (lVar43 != 0);
          puVar42 = (undefined1 *)
                    ((long)&(pCVar27->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                            m_storage.m_data + 6);
          if ((((this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_rows < (long)puVar42) ||
              (lVar36 = (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                        m_storage.m_cols, lVar36 < (long)puVar42)) ||
             ((local_e20.m_rows < (long)puVar42 || (local_e20.m_cols < (long)puVar42))))
          goto LAB_00684f6c;
          pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                     *)((long)&(pCVar27->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                               m_storage.m_data + 3);
          pdVar34 = (double *)
                    ((long)(this->M).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data + (lVar36 + 1) * (long)pCVar41 + 0x10);
          pdVar39 = (double *)
                    ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_data)->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                           m_data.array +
                    (long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_cols)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                 m_storage.m_data.array + 1) * (long)pCVar41 + 0x10);
          lVar43 = 3;
          do {
            dVar2 = pdVar34[-1];
            pdVar39[-2] = (double)local_b10 * pdVar34[-2] + pdVar39[-2];
            pdVar39[-1] = (double)pRStack_b08 * dVar2 + pdVar39[-1];
            *pdVar39 = (double)local_b00 * *pdVar34 + *pdVar39;
            pdVar34 = pdVar34 + lVar36;
            pdVar39 = pdVar39 + local_e20.m_cols;
            lVar43 = lVar43 + -1;
          } while (lVar43 != 0);
          local_e01._9_8_ = pCVar41;
          if (((this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows < lVar38) ||
             (pRVar33 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                         *)(this->M).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols, (long)pRVar33 < (long)puVar42)) goto LAB_00684f6c;
          local_ac0._8_8_ =
               (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data + (long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                      &pRVar32->
                                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                      )->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                     m_storage.m_data.array + (long)pRVar33 * (long)pCVar27);
          local_ac0._0_8_ =
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar44].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0x58;
          sStack_aa8.m_other = (double)local_e01._1_8_;
          local_e01._17_8_ = pCVar27;
          local_de8 = pRVar32;
          pCStack_aa0 = pCVar27;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data = (double *)pRVar32;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows = (Index)pRVar33;
          local_a80 = local_b00;
          ChMatrix33<double>::operator=
                    (&local_d88,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                      *)local_ac0);
          if ((local_e20.m_rows < lVar38) || (local_e20.m_cols < (long)puVar42)) goto LAB_00684f6c;
          pdVar34 = (double *)
                    ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_data)->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                           m_data.array + local_e20.m_cols * lVar46);
          lVar36 = 0x10;
          do {
            dVar2 = *(double *)((long)&local_da0.m_cols + lVar36);
            pdVar39 = (double *)((long)pdVar34 + lVar46 + 0x18);
            dVar3 = pdVar39[1];
            pdVar1 = (double *)((long)pdVar34 + lVar46 + 0x18);
            *pdVar1 = *(double *)((long)&local_da0.m_rows + lVar36) + *pdVar39;
            pdVar1[1] = dVar2 + dVar3;
            *(double *)((long)pdVar34 + lVar46 + 0x28) =
                 *(double *)
                  ((long)local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + lVar36) + *(double *)((long)pdVar34 + lVar46 + 0x28);
            lVar36 = lVar36 + 0x18;
            pdVar34 = pdVar34 + local_e20.m_cols;
          } while (lVar36 != 0x58);
          if ((local_e20.m_rows < (long)puVar42) || (local_e20.m_cols < lVar38)) goto LAB_00684f6c;
          pdVar34 = (((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_data)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                    array + (long)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                             *)local_e01._17_8_)->m_storage).m_data +
                                  (long)local_de8 * local_e20.m_cols);
          if (((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
               local_e20.m_data !=
               (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
               0x0) && (&local_d88 == (ChMatrix33<double> *)pdVar34)) {
            __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                          "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>, MightHaveTransposeAliasing = true]"
                         );
          }
          *pdVar34 = local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0] + *pdVar34;
          pdVar34[1] = local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[3] + pdVar34[1];
          pdVar34[2] = local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6] + pdVar34[2];
          pdVar34[local_e20.m_cols] =
               local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1] + pdVar34[local_e20.m_cols];
          pdVar34[(long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_cols)->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                               m_storage.m_data.array + 1)] =
               local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] + pdVar34[(long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_cols)->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          ).m_storage.m_data.array + 1)];
          pdVar34[(long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_cols)->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                               m_storage.m_data.array + 2)] =
               local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7] + pdVar34[(long)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_cols)->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          ).m_storage.m_data.array + 2)];
          pdVar34[local_e20.m_cols * 2] =
               local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2] + pdVar34[local_e20.m_cols * 2];
          pdVar34[local_e20.m_cols * 2 + 1] =
               local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5] + pdVar34[local_e20.m_cols * 2 + 1];
          pdVar34[local_e20.m_cols * 2 + 2] =
               local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] + pdVar34[local_e20.m_cols * 2 + 2];
          uVar44 = uVar44 + 1;
          lVar46 = lVar46 + 0x30;
          pCVar41 = (ChMatrixDynamic<> *)(local_e01._9_8_ + 0x30);
          H = (ChMatrixRef *)local_da8;
        } while (uVar44 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      CVar29 = _local_640;
      local_ac0._0_8_ =
           (((Matrix<double,_3,_3,_1,_3,_3> *)
            &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)H)
             ->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
           [0];
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           (Index)(((Matrix<double,_3,_3,_1,_3,_3> *)
                   &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                      *)H)->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data
                  .array[3];
      local_ac0._8_8_ =
           (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0xc;
      sStack_ab0.m_other = 5.92878775009496e-323;
      pCStack_aa0 = (ChMatrixDynamic<> *)0x0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      sStack_aa8.m_other = (double)H;
      if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                  &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                     *)H)->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                 array[1] < 0xc) ||
         ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                 &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                    *)H)->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                array[2] < 0xc)) {
LAB_00685009:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_e20.m_data;
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_e20.m_cols;
      if (((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
           local_e20.m_rows !=
           (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0xc)
         || ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
             local_e20.m_cols !=
             (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0xc)
         ) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      local_640._8_8_ = &local_188;
      local_640._0_8_ = &local_d30;
      vStack_630.m_value = (long)&local_128;
      auStack_628._8_32_ = CVar29._32_32_;
      auStack_628._0_8_ = (DstXprType *)local_ac0;
      local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_ac0._0_8_;
      local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)local_640);
LAB_00684f01:
      if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
          local_e20.m_data !=
          (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
        free((void *)(((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                        *)((long)local_e20.m_data + -0x40))->m_object).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_cols);
      }
      return;
    }
    pSVar22 = (SrcEvaluatorType *)
              (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_rows;
    paVar23 = (assign_op<double,_double> *)
              (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols;
    if (-1 < (long)((ulong)paVar23 | (ulong)pSVar22)) {
      local_ac0._0_8_ = &this->M;
      sStack_aa8.m_other = (double)local_e01._17_8_;
      local_ac0._8_8_ = pSVar22;
      sStack_ab0.m_other = (double)paVar23;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_e20,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                  *)local_ac0,(assign_op<double,_double> *)local_640);
      ChMatrix33<double>::ChMatrix33(&local_d30,&this->q_element_abs_rot);
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar25 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var26 = (psVar24->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
        }
      }
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)&peVar25->field_0x38;
      dVar2 = *(double *)&peVar25->field_0x40;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar2;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(double *)&peVar25->field_0x48;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(double *)&peVar25->field_0x50;
      dVar3 = (this->q_element_abs_rot).m_data[0];
      auVar84._8_8_ = 0;
      auVar84._0_8_ = dVar3;
      dVar4 = (this->q_element_abs_rot).m_data[1];
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar4;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = dVar2 * dVar4;
      auVar80 = vfmadd231sd_fma(auVar92,auVar56,auVar84);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = (this->q_element_abs_rot).m_data[2];
      auVar80 = vfmadd231sd_fma(auVar80,auVar68,auVar96);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = (this->q_element_abs_rot).m_data[3];
      auVar80 = vfmadd231sd_fma(auVar80,auVar76,auVar100);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = dVar3 * dVar2;
      auVar90 = vfmsub231sd_fma(auVar104,auVar56,auVar88);
      auVar90 = vfmadd231sd_fma(auVar90,auVar76,auVar96);
      auVar102 = vfnmadd231sd_fma(auVar90,auVar68,auVar100);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = dVar3 * *(double *)&peVar25->field_0x48;
      auVar90 = vfmsub231sd_fma(auVar108,auVar56,auVar96);
      auVar90 = vfnmadd231sd_fma(auVar90,auVar76,auVar88);
      auVar90 = vfmadd231sd_fma(auVar90,auVar62,auVar100);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = dVar3 * *(double *)&peVar25->field_0x50;
      auVar50 = vfmsub231sd_fma(auVar77,auVar56,auVar100);
      auVar50 = vfmadd231sd_fma(auVar50,auVar68,auVar88);
      auVar50 = vfnmadd231sd_fma(auVar50,auVar62,auVar96);
      local_ac0._0_8_ = auVar80._0_8_;
      local_ac0._8_8_ = auVar102._0_8_;
      sStack_ab0.m_other = auVar90._0_8_;
      sStack_aa8.m_other = auVar50._0_8_;
      ChMatrix33<double>::ChMatrix33(&local_188,(ChQuaternion<double> *)local_ac0);
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
      }
      psVar24 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar25 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var26 = psVar24[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
        }
      }
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)&peVar25->field_0x38;
      dVar2 = *(double *)&peVar25->field_0x40;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar2;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(double *)&peVar25->field_0x48;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(double *)&peVar25->field_0x50;
      dVar3 = (this->q_element_abs_rot).m_data[0];
      auVar85._8_8_ = 0;
      auVar85._0_8_ = dVar3;
      dVar4 = (this->q_element_abs_rot).m_data[1];
      auVar89._8_8_ = 0;
      auVar89._0_8_ = dVar4;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = dVar2 * dVar4;
      auVar80 = vfmadd231sd_fma(auVar93,auVar57,auVar85);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = (this->q_element_abs_rot).m_data[2];
      auVar80 = vfmadd231sd_fma(auVar80,auVar69,auVar97);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = (this->q_element_abs_rot).m_data[3];
      auVar80 = vfmadd231sd_fma(auVar80,auVar78,auVar101);
      auVar105._8_8_ = 0;
      auVar105._0_8_ = dVar3 * dVar2;
      auVar90 = vfmsub231sd_fma(auVar105,auVar57,auVar89);
      auVar90 = vfmadd231sd_fma(auVar90,auVar78,auVar97);
      auVar102 = vfnmadd231sd_fma(auVar90,auVar69,auVar101);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = dVar3 * *(double *)&peVar25->field_0x48;
      auVar90 = vfmsub231sd_fma(auVar109,auVar57,auVar97);
      auVar90 = vfnmadd231sd_fma(auVar90,auVar78,auVar89);
      auVar90 = vfmadd231sd_fma(auVar90,auVar63,auVar101);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = dVar3 * *(double *)&peVar25->field_0x50;
      auVar50 = vfmsub231sd_fma(auVar79,auVar57,auVar101);
      auVar50 = vfmadd231sd_fma(auVar50,auVar69,auVar89);
      auVar50 = vfnmadd231sd_fma(auVar50,auVar63,auVar97);
      local_ac0._0_8_ = auVar80._0_8_;
      local_ac0._8_8_ = auVar102._0_8_;
      sStack_ab0.m_other = auVar90._0_8_;
      sStack_aa8.m_other = auVar50._0_8_;
      ChMatrix33<double>::ChMatrix33(&local_128,(ChQuaternion<double> *)local_ac0);
      if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
      }
      local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
      local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
      local_ac0._0_8_ = &local_d30;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_e40,(iterator)0x0,(ChMatrix33<double> **)local_ac0);
      if (local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_ac0._0_8_ = &local_188;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_e40,
                   (iterator)
                   local_e40.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
      }
      else {
        *local_e40.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_188;
        local_e40.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e40.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_ac0._0_8_ = &local_d30;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_e40,
                   (iterator)
                   local_e40.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
      }
      else {
        *local_e40.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_d30;
        local_e40.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e40.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_ac0._0_8_ =
           (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
           &local_128;
      if (local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_e40,
                   (iterator)
                   local_e40.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
      }
      else {
        *local_e40.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_128;
        local_e40.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e40.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)0x0;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_rows = 0;
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_cols = 0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_cc0,&local_e20);
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0xc;
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0xc;
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0xc;
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)local_ac0;
      ChMatrixCorotation::ComputeCK(&local_cc0,&local_e40,4,local_a0);
      if (local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_data != (double *)0x0) {
        free((void *)local_cc0.m_object.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_data[-1]);
      }
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_rows = 0;
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_cols = 0;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0xc;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0xc;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0xc;
      local_e0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0xc;
      local_e0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0xc;
      local_e0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0xc;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)local_ac0;
      local_e0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)local_640;
      ChMatrixCorotation::ComputeKCt(&local_cc0,&local_e40,4,&local_e0);
      if (local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_data != (double *)0x0) {
        free((void *)local_cc0.m_object.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_data[-1]);
      }
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)
                (((Matrix<double,_3,_3,_1,_3,_3> *)
                 &local_da8->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                array[0];
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_rows = (Index)(((Matrix<double,_3,_3,_1,_3,_3> *)
                       &local_da8->
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                      m_data.array[3];
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0xc;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0xc;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = (long)local_da8;
      local_cc0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride._8_8_ = 0;
      local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                  &local_da8->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                 array[1] < 0xc) ||
         ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                 &local_da8->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                array[2] < 0xc)) goto LAB_00685009;
      local_ce0.m_src = (SrcEvaluatorType *)&local_da0;
      local_ce0.m_dst = (DstEvaluatorType *)&local_dc0;
      local_ce0.m_functor = (add_assign_op<double,_double> *)&local_de0;
      local_dc0.m_data =
           local_cc0.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_dc0.m_cols =
           local_cc0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
      local_da0.m_data = (double *)local_640;
      local_ce0.m_dstExpr = (DstXprType *)&local_cc0;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)(local_ce8 + 8));
      if (local_e40.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e40.
                        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e40.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e40.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00684f01;
    }
LAB_006850f8:
    pcVar35 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
    ;
LAB_0068510d:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar35);
  }
  local_dc0.m_data = (double *)0x0;
  local_dc0.m_rows = 0;
  local_dc0.m_cols = 0;
  local_e01._9_8_ = Kfactor;
  local_de8 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
              Rfactor;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_dc0,0x90,0xc,0xc);
  local_e20.m_data = (double *)0x0;
  local_e20.m_rows = 0;
  local_e20.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_e20,0x90,0xc,0xc);
  ChMatrix33<double>::ChMatrix33(&local_188,&this->q_element_abs_rot);
  psVar24 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar25 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var26 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
    }
  }
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)&peVar25->field_0x38;
  dVar2 = *(double *)&peVar25->field_0x40;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(double *)&peVar25->field_0x48;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(double *)&peVar25->field_0x50;
  dVar3 = (this->q_element_abs_rot).m_data[0];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar3;
  dVar4 = (this->q_element_abs_rot).m_data[1];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar4;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar2 * dVar4;
  auVar80 = vfmadd231sd_fma(auVar90,auVar50,auVar80);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = (this->q_element_abs_rot).m_data[2];
  auVar80 = vfmadd231sd_fma(auVar80,auVar64,auVar94);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = (this->q_element_abs_rot).m_data[3];
  auVar80 = vfmadd231sd_fma(auVar80,auVar70,auVar98);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar3 * dVar2;
  auVar90 = vfmsub231sd_fma(auVar102,auVar50,auVar86);
  auVar90 = vfmadd231sd_fma(auVar90,auVar70,auVar94);
  auVar102 = vfnmadd231sd_fma(auVar90,auVar64,auVar98);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar3 * *(double *)&peVar25->field_0x48;
  auVar90 = vfmsub231sd_fma(auVar106,auVar50,auVar94);
  auVar90 = vfnmadd231sd_fma(auVar90,auVar70,auVar86);
  auVar90 = vfmadd231sd_fma(auVar90,auVar58,auVar98);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar3 * *(double *)&peVar25->field_0x50;
  auVar50 = vfmsub231sd_fma(auVar71,auVar50,auVar98);
  auVar50 = vfmadd231sd_fma(auVar50,auVar64,auVar86);
  auVar50 = vfnmadd231sd_fma(auVar50,auVar58,auVar94);
  local_ac0._0_8_ = auVar80._0_8_;
  local_ac0._8_8_ = auVar102._0_8_;
  sStack_ab0.m_other = auVar90._0_8_;
  sStack_aa8.m_other = auVar50._0_8_;
  ChMatrix33<double>::ChMatrix33(&local_128,(ChQuaternion<double> *)local_ac0);
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
  }
  psVar24 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar25 = psVar24[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var26 = psVar24[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
    }
  }
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)&peVar25->field_0x38;
  dVar2 = *(double *)&peVar25->field_0x40;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(double *)&peVar25->field_0x48;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(double *)&peVar25->field_0x50;
  dVar3 = (this->q_element_abs_rot).m_data[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar3;
  dVar4 = (this->q_element_abs_rot).m_data[1];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar4;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar2 * dVar4;
  auVar80 = vfmadd231sd_fma(auVar91,auVar51,auVar81);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (this->q_element_abs_rot).m_data[2];
  auVar80 = vfmadd231sd_fma(auVar80,auVar65,auVar95);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = (this->q_element_abs_rot).m_data[3];
  auVar80 = vfmadd231sd_fma(auVar80,auVar72,auVar99);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar3 * dVar2;
  auVar90 = vfmsub231sd_fma(auVar103,auVar51,auVar87);
  auVar90 = vfmadd231sd_fma(auVar90,auVar72,auVar95);
  auVar102 = vfnmadd231sd_fma(auVar90,auVar65,auVar99);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar3 * *(double *)&peVar25->field_0x48;
  auVar90 = vfmsub231sd_fma(auVar107,auVar51,auVar95);
  auVar90 = vfnmadd231sd_fma(auVar90,auVar72,auVar87);
  auVar90 = vfmadd231sd_fma(auVar90,auVar59,auVar99);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar3 * *(double *)&peVar25->field_0x50;
  auVar50 = vfmsub231sd_fma(auVar73,auVar51,auVar99);
  auVar50 = vfmadd231sd_fma(auVar50,auVar65,auVar87);
  auVar50 = vfnmadd231sd_fma(auVar50,auVar59,auVar95);
  local_ac0._0_8_ = auVar80._0_8_;
  local_ac0._8_8_ = auVar102._0_8_;
  sStack_ab0.m_other = auVar90._0_8_;
  sStack_aa8.m_other = auVar50._0_8_;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_cc0,(ChQuaternion<double> *)local_ac0)
  ;
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
  }
  local_e40.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e40.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
  local_e40.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
  local_ac0._0_8_ = &local_188;
  std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
  _M_realloc_insert<chrono::ChMatrix33<double>*>
            ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
             &local_e40,(iterator)0x0,(ChMatrix33<double> **)local_ac0);
  if (local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_ac0._0_8_ = &local_128;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_e40,
               (iterator)
               local_e40.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
  }
  else {
    *local_e40.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_128;
    local_e40.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e40.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_ac0._0_8_ = &local_188;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_e40,
               (iterator)
               local_e40.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
  }
  else {
    *local_e40.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_188;
    local_e40.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e40.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_ac0._0_8_ = &local_cc0;
  if (local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e40.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_e40,
               (iterator)
               local_e40.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
  }
  else {
    *local_e40.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> *)&local_cc0;
    local_e40.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e40.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (this->use_geometric_stiffness == true) {
    iVar31 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d30,(long)iVar31);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,(Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                     *)&local_d30);
    CVar29 = _local_640;
    vVar17.m_value =
         (long)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_data;
    pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
              (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols;
    if ((long)pRVar32 < 0 &&
        (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
        vVar17.m_value !=
        (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
      pcVar35 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
      ;
      goto LAB_00685162;
    }
    if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        < 1) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                   );
    }
    if (pRVar32 !=
        (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
        local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    pCVar41 = &this->Km;
    local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 1);
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0
    ;
    local_ac0._8_8_ = vVar17.m_value;
    sStack_aa8.m_other = (double)pRVar32;
    pCStack_aa0 = pCVar41;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         (Index)pRVar32;
    pRStack_a78 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *
                  )&local_d30;
    if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
        local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] ==
        (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
      local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    }
    else {
      if ((long)local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1] < 1) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      vStack_630.m_value = vVar17.m_value;
      auStack_628._8_8_ = pRVar32;
      auStack_628._24_16_ = CVar29._48_16_;
      auStack_628._16_8_ =
           local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
           ::
           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_640,(scalar_sum_op<double,_double> *)(local_ce8 + 8),
                      (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_ac0);
    }
    CVar29 = _local_640;
    vVar17.m_value =
         (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    pDVar18 = (DstXprType *)
              (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols;
    if ((long)((ulong)pDVar18 | vVar17.m_value) < 0) goto LAB_006850f8;
    local_640._0_8_ = pCVar41;
    vStack_630.m_value = vVar17.m_value;
    auStack_628._0_8_ = pDVar18;
    auStack_628._8_8_ =
         *(double *)
          local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auStack_628._24_16_ = CVar29._48_16_;
    auStack_628._16_8_ = &this->Kg;
    if (((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows != vVar17.m_value) ||
       ((DstXprType *)
        (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != pDVar18)) {
      pcVar35 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>]"
      ;
      goto LAB_0068512c;
    }
    local_ac0._0_8_ = (ChMatrix33<double> *)0x0;
    local_ac0._8_8_ = (SrcEvaluatorType *)0x0;
    sStack_ab0.m_other = 0.0;
    sStack_aa8.m_other = 0.0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0
    ;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0
    ;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
              (&MStack_a98,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                *)local_640,(assign_op<double,_double> *)&local_d88);
    local_ac0._0_8_ =
         MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_data;
    local_ac0._8_8_ =
         MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    sStack_ab0.m_other =
         (double)MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
    if ((MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows | MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols) < 0 &&
        (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        != (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
      pcVar35 = 
      "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
      ;
      goto LAB_00685162;
    }
    sStack_aa8.m_other =
         (double)MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
    local_b40.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 0;
    local_b40.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = local_dc0.m_data;
    local_b40.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = local_dc0.m_rows;
    local_b40.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = local_dc0.m_cols;
    if (-1 < (local_dc0.m_rows | local_dc0.m_cols) || local_dc0.m_data == (double *)0x0) {
      local_b40.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = local_dc0.m_cols;
      ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_ac0,&local_e40,4,&local_b40);
      pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [0];
      if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data != (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                     *)0x0) {
        free(*(void **)((long)MStack_a98.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + -8));
        pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *
                  )local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
      }
      goto LAB_00683522;
    }
  }
  else {
    local_ac0._0_8_ =
         (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0;
    local_ac0._8_8_ =
         (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0;
    sStack_ab0.m_other = 0.0;
    sStack_aa8.m_other = 0.0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0
    ;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0
    ;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_ac0,
               &this->Km);
    local_b80.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 0;
    local_b80.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = local_dc0.m_data;
    local_b80.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = local_dc0.m_rows;
    local_b80.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = local_dc0.m_cols;
    if (-1 < (local_dc0.m_rows | local_dc0.m_cols) || local_dc0.m_data == (double *)0x0) {
      local_b80.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = local_dc0.m_cols;
      ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_ac0,&local_e40,4,&local_b80);
      pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
LAB_00683522:
      if (pRVar32 !=
          (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
        free((void *)pRVar32[-1].m_object.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_cols);
      }
      local_ac0._0_8_ =
           (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0;
      local_ac0._8_8_ =
           (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0;
      sStack_ab0.m_other = 0.0;
      sStack_aa8.m_other = 0.0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
           0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_ac0
                 ,&local_dc0);
      local_bc0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_bc0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = local_e20.m_data;
      local_bc0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = local_e20.m_rows;
      local_bc0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = local_e20.m_cols;
      if (-1 < (local_e20.m_rows | local_e20.m_cols) ||
          (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
          local_e20.m_data ==
          (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
        local_bc0.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = local_e20.m_cols;
        ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)local_ac0,&local_e40,4,&local_bc0);
        if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
            MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_data != (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                       *)0x0) {
          free(*(void **)((long)MStack_a98.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_data + -8));
        }
        if (this->force_symmetric_stiffness == true) {
          pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                     *)0x1;
          if (1 < local_e20.m_rows) {
            pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                       *)local_e20.m_rows;
          }
          if (pRVar32 !=
              (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x1
             ) {
            lVar46 = 0;
            puVar42 = (undefined1 *)0x0;
            pRVar33 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                       *)local_e20.m_rows;
            pRVar40 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                       *)local_e20.m_cols;
            do {
              puVar42 = puVar42 + 1;
              if ((long)puVar42 < local_e20.m_cols) {
                pRVar45 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)0x1;
                pRVar37 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)local_e20.m_cols;
                do {
                  if (pRVar33 == pRVar45) goto LAB_00684f28;
                  *(undefined8 *)
                   ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_data)->
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                          m_data.array + (long)pRVar45 * 8 + lVar46) =
                       *(undefined8 *)
                        ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_e20.m_data)->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                               m_storage.m_data.array + (long)pRVar37 * 8 + lVar46);
                  pRVar45 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                             *)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                       &pRVar45->
                                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       )->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                      m_storage.m_data.array + 1);
                  pRVar37 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                             *)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                       &pRVar37->
                                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       )->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                      m_storage.m_data.array + local_e20.m_cols);
                } while (pRVar40 != pRVar45);
              }
              pRVar33 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                         *)((long)&pRVar33[-1].m_object.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_cols + 7);
              lVar46 = lVar46 + local_e20.m_cols * 8 + 8;
              pRVar40 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                         *)((long)&pRVar40[-1].m_object.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_cols + 7);
            } while (puVar42 !=
                     (undefined1 *)
                     ((long)&pRVar32[-1].m_object.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols + 7));
          }
        }
        local_da0.m_data = (double *)0x0;
        local_da0.m_rows = 0;
        local_da0.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_da0,0x90,0xc,0xc);
        local_de0.m_data = (double *)0x0;
        local_de0.m_rows = 0;
        local_de0.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_de0,0x90,0xc,0xc);
        local_ac0._0_8_ =
             (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0;
        local_ac0._8_8_ =
             (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0;
        sStack_ab0.m_other = 0.0;
        sStack_aa8.m_other = 0.0;
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
             = 0;
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
             = 0;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_ac0,&this->Rm);
        local_c00.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_c00.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_da0.m_data;
        local_c00.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_da0.m_rows;
        local_c00.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = local_da0.m_cols;
        if (-1 < (local_da0.m_rows | local_da0.m_cols) || local_da0.m_data == (double *)0x0) {
          local_c00.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = local_da0.m_cols;
          ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_ac0,&local_e40,4,&local_c00);
          if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
              MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data != (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                         *)0x0) {
            free(*(void **)((long)MStack_a98.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                  m_storage.m_data + -8));
          }
          local_ac0._0_8_ =
               (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
               0x0;
          local_ac0._8_8_ =
               (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
               0x0;
          sStack_ab0.m_other = 0.0;
          sStack_aa8.m_other = 0.0;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows = 0;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols = 0;
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
          construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     local_ac0,&local_da0);
          local_c40.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 0;
          local_c40.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = local_de0.m_data;
          local_c40.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = local_de0.m_rows;
          local_c40.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = local_de0.m_cols;
          if (-1 < (local_de0.m_rows | local_de0.m_cols) ||
              (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
              local_de0.m_data ==
              (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0
             ) {
            local_c40.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = local_de0.m_cols;
            ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)local_ac0,&local_e40,4,&local_c40);
            if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data !=
                (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                0x0) {
              free(*(void **)((long)MStack_a98.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    .m_storage.m_data + -8));
            }
            CVar29 = _local_640;
            if (this->force_symmetric_stiffness == true) {
              pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                         *)0x1;
              if (1 < local_de0.m_rows) {
                pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)local_de0.m_rows;
              }
              if (pRVar32 !=
                  (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *
                  )0x1) {
                lVar46 = 0;
                puVar42 = (undefined1 *)0x0;
                pRVar33 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)local_de0.m_rows;
                pRVar40 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)local_de0.m_cols;
                do {
                  puVar42 = puVar42 + 1;
                  if ((long)puVar42 < local_de0.m_cols) {
                    pRVar45 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                               *)0x1;
                    pRVar37 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                               *)local_de0.m_cols;
                    do {
                      if (pRVar33 == pRVar45) {
LAB_00684f28:
                        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                                     );
                      }
                      *(undefined8 *)
                       ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_de0.m_data)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                              m_storage.m_data.array + (long)pRVar45 * 8 + lVar46) =
                           *(undefined8 *)
                            ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)local_de0.m_data)->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                   m_storage.m_data.array + (long)pRVar37 * 8 + lVar46);
                      pRVar45 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                                 *)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                           &pRVar45->
                                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           )->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          ).m_storage.m_data.array + 1);
                      pRVar37 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                                 *)((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                           &pRVar37->
                                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           )->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          ).m_storage.m_data.array + local_de0.m_cols);
                    } while (pRVar40 != pRVar45);
                  }
                  pRVar33 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                             *)((long)&pRVar33[-1].m_object.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                       .m_storage.m_cols + 7);
                  lVar46 = lVar46 + local_de0.m_cols * 8 + 8;
                  pRVar40 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                             *)((long)&pRVar40[-1].m_object.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                       .m_storage.m_cols + 7);
                } while (puVar42 !=
                         (undefined1 *)
                         ((long)&pRVar32[-1].m_object.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_cols + 7));
              }
            }
            if (((local_e20.m_cols | local_e20.m_rows) < 0) ||
               ((local_de0.m_cols | local_de0.m_rows) < 0)) goto LAB_006850f8;
            if ((local_e20.m_rows != local_de0.m_rows) || (local_e20.m_cols != local_de0.m_cols)) {
              pcVar35 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>]"
              ;
LAB_0068512c:
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar35);
            }
            pRVar32 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                       *)(H->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         ).
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                         .
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_data;
            auStack_628._24_8_ =
                 (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
            local_640 = CONCAT88(0xc,pRVar32);
            _local_640 = (MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          )CONCAT816(0xc,local_640);
            _local_640 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                          )CONCAT824(H,_local_640);
            _local_640 = (evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          )ZEXT3248((undefined1  [32])_local_640);
            auStack_628._32_8_ = CVar29._56_8_;
            if (((H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value < 0xc) ||
               ((H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value < 0xc)) goto LAB_00685009;
            sStack_ab0.m_other = (double)local_e20.m_data;
            sStack_aa8.m_other = (double)local_e20.m_cols;
            pCStack_aa0 = (ChMatrixDynamic<> *)local_e01._9_8_;
            MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols = (Index)local_de0.m_data;
            local_a80 = (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                         *)local_de0.m_cols;
            pRStack_a78 = local_de8;
            if (((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 local_de0.m_rows !=
                 (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 0xc) || ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)local_de0.m_cols !=
                          (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                           *)0xc)) {
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                            "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
                           );
            }
            local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)&local_d30;
            local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 (double)(local_ce8 + 8);
            local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
                 (double)local_640;
            local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)local_ac0;
            local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)pRVar32;
            local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 (double)auStack_628._24_8_;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)&local_d88);
            peVar19 = (this->tapered_section).
                      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            if ((peVar19->compute_inertia_damping_matrix != false) ||
               (peVar19->compute_inertia_stiffness_matrix == true)) {
              memset(local_640,0,0x480);
              local_e01._1_8_ = (this->super_ChElementBeam).length;
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar25 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var26 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)&(peVar25->super_ChNodeFEAbase).field_0x18);
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar25 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var26 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWacc_loc
                        ((ChFrameMoving<double> *)&(peVar25->super_ChNodeFEAbase).field_0x18);
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar25 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var26 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar20 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var21 = (psVar24->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                }
              }
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)&peVar20->field_0xd8;
              dVar2 = *(double *)&peVar20->field_0xe0;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)&peVar25->field_0x58;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = dVar2 * *(double *)&peVar25->field_0x70;
              auVar80 = vfmadd231sd_fma(auVar66,auVar52,auVar5);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = *(ulong *)&peVar20->field_0xe8;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)&peVar25->field_0x88;
              auVar80 = vfmadd231sd_fma(auVar80,auVar74,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)&peVar25->field_0x60;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = dVar2 * *(double *)&peVar25->field_0x78;
              auVar90 = vfmadd231sd_fma(auVar82,auVar52,auVar7);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *(ulong *)&peVar25->field_0x90;
              auVar90 = vfmadd231sd_fma(auVar90,auVar74,auVar8);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)&peVar25->field_0x68;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = dVar2 * *(double *)&peVar25->field_0x80;
              auVar50 = vfmadd231sd_fma(auVar60,auVar52,auVar9);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *(ulong *)&peVar25->field_0x98;
              auVar50 = vfmadd231sd_fma(auVar50,auVar74,auVar10);
              local_c58 = auVar80._0_8_;
              local_c50 = auVar90._0_8_;
              local_c48 = auVar50._0_8_;
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
              }
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar25 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var26 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)&(peVar25->super_ChNodeFEAbase).field_0x18);
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar25 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var26 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWacc_loc
                        ((ChFrameMoving<double> *)&(peVar25->super_ChNodeFEAbase).field_0x18);
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar25 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var26 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              psVar24 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar20 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var21 = psVar24[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                }
              }
              auVar53._8_8_ = 0;
              auVar53._0_8_ = *(ulong *)&peVar20->field_0xd8;
              dVar2 = *(double *)&peVar20->field_0xe0;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *(ulong *)&peVar25->field_0x58;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = dVar2 * *(double *)&peVar25->field_0x70;
              auVar80 = vfmadd231sd_fma(auVar67,auVar53,auVar11);
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)&peVar20->field_0xe8;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)&peVar25->field_0x88;
              auVar80 = vfmadd231sd_fma(auVar80,auVar75,auVar12);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = *(ulong *)&peVar25->field_0x60;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = dVar2 * *(double *)&peVar25->field_0x78;
              auVar90 = vfmadd231sd_fma(auVar83,auVar53,auVar13);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)&peVar25->field_0x90;
              auVar90 = vfmadd231sd_fma(auVar90,auVar75,auVar14);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)&peVar25->field_0x68;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = dVar2 * *(double *)&peVar25->field_0x80;
              auVar50 = vfmadd231sd_fma(auVar61,auVar53,auVar15);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)&peVar25->field_0x98;
              auVar50 = vfmadd231sd_fma(auVar50,auVar75,auVar16);
              local_c70 = auVar80._0_8_;
              local_c68 = auVar90._0_8_;
              local_c60 = auVar50._0_8_;
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
              }
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              local_e01._1_8_ = (double)local_e01._1_8_ * 0.5;
              peVar19 = (this->tapered_section).
                        super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (peVar19->compute_inertia_damping_matrix == true) {
                (*peVar19->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[3])
                          (peVar19,local_ac0,local_ad8,local_af0);
                auVar54._8_8_ = 0;
                auVar54._0_8_ = (double)local_e01._1_8_ * (double)local_de8;
                auVar47 = vbroadcastsd_avx512f(auVar54);
                auVar48._8_8_ = local_ac0._8_8_;
                auVar48._0_8_ = local_ac0._0_8_;
                auVar48._16_8_ = sStack_ab0.m_other;
                auVar48._24_8_ = sStack_aa8.m_other;
                auVar48._32_8_ = pCStack_aa0;
                auVar48._40_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data;
                auVar48._48_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
                auVar48._56_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols;
                auVar48 = vmulpd_avx512f(auVar47,auVar48);
                _local_640 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                              )vaddpd_avx512f(auVar48,(undefined1  [64])_local_640);
                auVar49._8_8_ = pRStack_a78;
                auVar49._0_8_ = local_a80;
                auVar49._16_48_ = auStack_a70;
                auVar48 = vmulpd_avx512f(auVar47,auVar49);
                auStack_628._40_64_ = vaddpd_avx512f(auVar48,auStack_628._40_64_);
                auVar48 = vmulpd_avx512f(auVar47,local_a40);
                local_5c0 = vaddpd_avx512f(auVar48,local_5c0);
                auVar48 = vmulpd_avx512f(auVar47,local_a00);
                local_580 = vaddpd_avx512f(auVar48,local_580);
                auVar48 = vmulpd_avx512f(auVar47,local_9c0);
                local_540 = vaddpd_avx512f(auVar48,local_540);
                auVar48 = vmulpd_avx512f(auVar47,local_980);
                local_500 = vaddpd_avx512f(auVar48,local_500);
                auVar48 = vmulpd_avx512f(auVar47,local_940);
                local_4c0 = vaddpd_avx512f(auVar48,local_4c0);
                auVar48 = vmulpd_avx512f(auVar47,local_900);
                local_480 = vaddpd_avx512f(auVar48,local_480);
                auVar48 = vmulpd_avx512f(auVar47,local_8c0);
                local_440 = vaddpd_avx512f(auVar48,local_440);
                auVar48 = vmulpd_avx512f(auVar47,local_880);
                local_400 = vaddpd_avx512f(auVar48,local_400);
                auVar48 = vmulpd_avx512f(auVar47,local_840);
                local_3c0 = vaddpd_avx512f(auVar48,local_3c0);
                auVar48 = vmulpd_avx512f(auVar47,local_800);
                local_380 = vaddpd_avx512f(auVar48,local_380);
                auVar48 = vmulpd_avx512f(auVar47,local_7c0);
                local_340 = vaddpd_avx512f(auVar48,local_340);
                auVar48 = vmulpd_avx512f(auVar47,local_780);
                local_300 = vaddpd_avx512f(auVar48,local_300);
                auVar48 = vmulpd_avx512f(auVar47,local_740);
                local_2c0 = vaddpd_avx512f(auVar48,local_2c0);
                auVar48 = vmulpd_avx512f(auVar47,local_700);
                local_280 = vaddpd_avx512f(auVar48,local_280);
                auVar48 = vmulpd_avx512f(auVar47,local_6c0);
                local_240 = vaddpd_avx512f(auVar48,local_240);
                auVar48 = vmulpd_avx512f(auVar47,_local_680);
                local_200 = vaddpd_avx512f(auVar48,local_200);
              }
              peVar19 = (this->tapered_section).
                        super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (peVar19->compute_inertia_stiffness_matrix == true) {
                (*peVar19->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[4])
                          (peVar19,local_ac0,local_ad8,local_af0,&local_c58,local_1a0,local_140,
                           &local_c70);
                auVar55._8_8_ = 0;
                auVar55._0_8_ = (double)local_e01._1_8_ * (double)local_e01._9_8_;
                auVar48 = vbroadcastsd_avx512f(auVar55);
                auVar47._8_8_ = local_ac0._8_8_;
                auVar47._0_8_ = local_ac0._0_8_;
                auVar47._16_8_ = sStack_ab0.m_other;
                auVar47._24_8_ = sStack_aa8.m_other;
                auVar47._32_8_ = pCStack_aa0;
                auVar47._40_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data;
                auVar47._48_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
                auVar47._56_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols;
                auVar49 = vmulpd_avx512f(auVar48,auVar47);
                _local_640 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                              )vaddpd_avx512f(auVar49,(undefined1  [64])_local_640);
                auVar28._8_8_ = pRStack_a78;
                auVar28._0_8_ = local_a80;
                auVar28._16_48_ = auStack_a70;
                auVar49 = vmulpd_avx512f(auVar48,auVar28);
                auStack_628._40_64_ = vaddpd_avx512f(auVar49,auStack_628._40_64_);
                auVar49 = vmulpd_avx512f(auVar48,local_a40);
                local_5c0 = vaddpd_avx512f(auVar49,local_5c0);
                auVar49 = vmulpd_avx512f(auVar48,local_a00);
                local_580 = vaddpd_avx512f(auVar49,local_580);
                auVar49 = vmulpd_avx512f(auVar48,local_9c0);
                local_540 = vaddpd_avx512f(auVar49,local_540);
                auVar49 = vmulpd_avx512f(auVar48,local_980);
                local_500 = vaddpd_avx512f(auVar49,local_500);
                auVar49 = vmulpd_avx512f(auVar48,local_940);
                local_4c0 = vaddpd_avx512f(auVar49,local_4c0);
                auVar49 = vmulpd_avx512f(auVar48,local_900);
                local_480 = vaddpd_avx512f(auVar49,local_480);
                auVar49 = vmulpd_avx512f(auVar48,local_8c0);
                local_440 = vaddpd_avx512f(auVar49,local_440);
                auVar49 = vmulpd_avx512f(auVar48,local_880);
                local_400 = vaddpd_avx512f(auVar49,local_400);
                auVar49 = vmulpd_avx512f(auVar48,local_840);
                local_3c0 = vaddpd_avx512f(auVar49,local_3c0);
                auVar49 = vmulpd_avx512f(auVar48,local_800);
                local_380 = vaddpd_avx512f(auVar49,local_380);
                auVar49 = vmulpd_avx512f(auVar48,local_7c0);
                local_340 = vaddpd_avx512f(auVar49,local_340);
                auVar49 = vmulpd_avx512f(auVar48,local_780);
                local_300 = vaddpd_avx512f(auVar49,local_300);
                auVar49 = vmulpd_avx512f(auVar48,local_740);
                local_2c0 = vaddpd_avx512f(auVar49,local_2c0);
                auVar49 = vmulpd_avx512f(auVar48,local_700);
                local_280 = vaddpd_avx512f(auVar49,local_280);
                auVar49 = vmulpd_avx512f(auVar48,local_6c0);
                local_240 = vaddpd_avx512f(auVar49,local_240);
                auVar48 = vmulpd_avx512f(auVar48,_local_680);
                local_200 = vaddpd_avx512f(auVar48,local_200);
              }
              pRVar32 = local_da8;
              if ((this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                pCVar41 = (ChMatrixDynamic<> *)0x18;
                uVar44 = 0;
                do {
                  lVar46 = uVar44 * 6 + 6;
                  if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                              &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                                 *)H)->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                             m_storage.m_data.array[1] < lVar46) ||
                     ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                             &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                                *)H)->
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                            m_storage.m_data.array[2] < lVar46)) {
LAB_00684f49:
                    pcVar35 = 
                    "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
                    ;
                    goto LAB_00684f81;
                  }
                  dVar2 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                           &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                              *)H)->
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                          m_storage.m_data.array[3];
                  pdVar34 = (double *)
                            ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                                    &((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                                       *)H)->
                                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                    )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>)
                                   .m_storage.m_data.array[0] + 0x10 +
                            ((long)dVar2 + 1) * (long)pCVar41);
                  lVar38 = 0x148;
                  do {
                    dVar3 = *(double *)(local_680 + lVar38 + 0x38);
                    pdVar34[-2] = *(double *)(local_680 + lVar38 + 0x30) + pdVar34[-2];
                    pdVar34[-1] = dVar3 + pdVar34[-1];
                    *pdVar34 = *(double *)(local_640 + lVar38) + *pdVar34;
                    lVar38 = lVar38 + 0x60;
                    pdVar34 = pdVar34 + (long)dVar2;
                  } while (lVar38 != 0x268);
                  local_e01._9_8_ = pCVar41;
                  if (((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                              &pRVar32->
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                             m_storage.m_data.array[1] < (long)(uVar44 * 6 + 3)) ||
                     ((long)(((Matrix<double,_3,_3,_1,_3,_3> *)
                             &pRVar32->
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                            m_storage.m_data.array[2] < lVar46)) goto LAB_00684f49;
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = (double)&((this->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar44].
                                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->field_0x58;
                  dVar2 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                           &pRVar32->
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                          m_storage.m_data.array[0];
                  dVar3 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                           &pRVar32->
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                          m_storage.m_data.array[3];
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = (double)(local_640 + 0x18);
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3] = (double)local_640;
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] = 0.0;
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] = 1.48219693752374e-323;
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = 5.92878775009496e-323;
                  local_d38 = 3;
                  local_ce8 = (undefined1  [8])&local_d30;
                  local_ce0.m_dst = (DstEvaluatorType *)(&local_d30 + 1);
                  local_ce0.m_src = (SrcEvaluatorType *)&local_d88;
                  local_ce0.m_functor = (add_assign_op<double,_double> *)local_e01;
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7] = local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0];
                  local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8] = local_d88.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[1];
                  local_ce0.m_dstExpr = (DstXprType *)local_ce8;
                  Eigen::internal::
                  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)(local_ce8 + 8));
                  pdVar34 = (double *)
                            ((uVar44 * 6 + 3) * 8 + (long)dVar2 + uVar44 * 6 * (long)dVar3 * 8);
                  dVar2 = (((Matrix<double,_3,_3,_1,_3,_3> *)
                           &pRVar32->
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                          m_storage.m_data.array[3];
                  *pdVar34 = local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0] + *pdVar34;
                  pdVar34[1] = local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[3] + pdVar34[1];
                  pdVar34[2] = local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] + pdVar34[2];
                  pdVar34[(long)dVar2] =
                       local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] + pdVar34[(long)dVar2];
                  pdVar34[(long)dVar2 + 1] =
                       local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4] + pdVar34[(long)dVar2 + 1];
                  pdVar34[(long)dVar2 + 2] =
                       local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[7] + pdVar34[(long)dVar2 + 2];
                  pdVar34[(long)dVar2 * 2] =
                       local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2] + pdVar34[(long)dVar2 * 2];
                  pdVar34[(long)dVar2 * 2 + 1] =
                       local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] + pdVar34[(long)dVar2 * 2 + 1];
                  pdVar34[(long)dVar2 * 2 + 2] =
                       local_d30.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8] + pdVar34[(long)dVar2 * 2 + 2];
                  uVar44 = uVar44 + 1;
                  pCVar41 = (ChMatrixDynamic<> *)(local_e01._9_8_ + 0x30);
                  H = (ChMatrixRef *)pRVar32;
                } while (uVar44 < (ulong)((long)(this->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
            }
            if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                local_de0.m_data !=
                (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                0x0) {
              free((void *)(((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                              *)((long)local_de0.m_data + -0x40))->m_object).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols);
            }
            if (local_da0.m_data != (double *)0x0) {
              free((void *)local_da0.m_data[-1]);
            }
            if (local_e40.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e40.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_e40.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e40.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                local_e20.m_data !=
                (Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                0x0) {
              free((void *)(((Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                              *)((long)local_e20.m_data + -0x40))->m_object).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols);
            }
            if (local_dc0.m_data != (double *)0x0) {
              free((void *)local_dc0.m_data[-1]);
            }
            goto LAB_0068447c;
          }
        }
      }
    }
  }
  pcVar35 = 
  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
  ;
LAB_00685162:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar35);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef H,
                                                              double Kfactor,
                                                              double Rfactor,
                                                              double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(tapered_section);

    //
    // The K stiffness matrix and R damping matrix of this element:
    //

    if (Kfactor || Rfactor) {
        // Corotational K stiffness:
        ChMatrixDynamic<> CK(12, 12);
        ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix

        //
        // Corotate local stiffness matrix
        //

        ChMatrix33<> Atoabs(this->q_element_abs_rot);
        ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        std::vector<ChMatrix33<>*> R;
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelA);
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelB);

        if (this->use_geometric_stiffness) {
            // compute Px tension of the beam along centerline, using temporary but fast data structures:
            ChVectorDynamic<> displ(this->GetNdofs());
            this->GetStateBlock(displ);
            double Px = -this->Km.row(0) * displ;
            // ChVector<> mFo, mTo;
            // this->EvaluateSectionForceTorque(0, mFo, mTo);  // for double checking the Px value
            // GetLog() << "   Px = " << Px << "  Px_eval = " << mFo.x() << " \n";

            // corotate Km + Kg  (where Kg = this->Kg * Px)
            ChMatrixCorotation::ComputeCK(this->Km + Px * this->Kg, R, 4, CK);
        } else {
            ChMatrixCorotation::ComputeCK(this->Km, R, 4, CK);
        }
        ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

        // For strict symmetry, copy L=U because the computations above might
        // lead to small errors because of numerical roundoff even with force_symmetric_stiffness
        if (force_symmetric_stiffness) {
            for (int row = 0; row < CKCt.rows() - 1; ++row)
                for (int col = row + 1; col < CKCt.cols(); ++col)
                    CKCt(row, col) = CKCt(col, row);
        }

        //// RADU
        //// Check if the above can be done with the one-liner:
        ////CKCt.triangularView<Eigen::Upper>() = CKCt.transpose();

        // The code below may be quite slow!!
        ChMatrixDynamic<> CR(12, 12);
        ChMatrixDynamic<> CRCt(12, 12);  // the global, corotated, R matrix
        ChMatrixCorotation::ComputeCK(this->Rm, R, 4, CR);
        ChMatrixCorotation::ComputeKCt(CR, R, 4, CRCt);
        if (force_symmetric_stiffness) {
            for (int row = 0; row < CRCt.rows() - 1; ++row)
                for (int col = row + 1; col < CRCt.cols(); ++col)
                    CRCt(row, col) = CRCt(col, row);
        }

        //// For K stiffness matrix and R matrix: scale by factors
        // CKCt *= Kfactor + Rfactor * this->tapered_section->GetBeamRaleyghDamping();

        H.block(0, 0, 12, 12) = CKCt * Kfactor + CRCt * Rfactor;

        // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping),
        // if enabled in this beam element.
        // These matrices are not symmetric. Also note.
        if (this->tapered_section->compute_inertia_damping_matrix ||
            this->tapered_section->compute_inertia_stiffness_matrix) {
            ChMatrixNM<double, 12, 12> matr_loc;
            ChMatrixNM<double, 12, 12> KRi_loc;
            KRi_loc.setZero();
            // A lumped version of the inertial damping/stiffness matrix computation is used here, on a per-node basis:
            double node_multiplier_fact_R = 0.5 * length * Rfactor;
            double node_multiplier_fact_K = 0.5 * length * Kfactor;

            ///< current angular velocity of section of node A, in material frame
            ChVector<> mWvel_A = this->GetNodeA()->GetWvel_loc();
            ///< current angular acceleration of section of node A, in material frame
            ChVector<> mWacc_A = this->GetNodeA()->GetWacc_loc();
            ///< current acceleration of section of node A, in material frame)
            ChVector<> mXacc_A = this->GetNodeA()->TransformDirectionParentToLocal(this->GetNodeA()->GetPos_dtdt());
            ///< current angular velocity of section of node B, in material frame
            ChVector<> mWvel_B = this->GetNodeB()->GetWvel_loc();
            ///< current angular acceleration of section of node B, in material frame
            ChVector<> mWacc_B = this->GetNodeB()->GetWacc_loc();
            ///< current acceleration of section of node B, in material frame
            ChVector<> mXacc_B = this->GetNodeB()->TransformDirectionParentToLocal(this->GetNodeB()->GetPos_dtdt());

            if (this->tapered_section->compute_inertia_damping_matrix) {
                this->tapered_section->ComputeInertiaDampingMatrix(matr_loc, mWvel_A, mWacc_A);
                KRi_loc += matr_loc * node_multiplier_fact_R;
                // check the inertial damping matrix, it should be skew symmetric
                // if ((matr_loc + matr_loc.transpose()).norm() < 1E-9) {
                //    std::cout << "Gyroscopic damping matrix is skew symmetric, that's correct！" << std::endl;
                //} else {
                //    std::cout << "Gyroscopic damping matrix is NOT skew symmetric, something is wrong!" << std::endl;
                //}
            }

            if (this->tapered_section->compute_inertia_stiffness_matrix) {
                this->tapered_section->ComputeInertiaStiffnessMatrix(matr_loc, mWvel_A, mWacc_A, mXacc_A, mWvel_B,
                                                                     mWacc_B, mXacc_B);
                KRi_loc += matr_loc * node_multiplier_fact_K;
                // check the inertial stiffness matrix, is it must be skew symmetric as the stiffness matrix?
                // if ((matr_loc + matr_loc.transpose()).norm() < 1E-9) {
                //    std::cout << "Inertial stiffness matrix is skew symmetric" << std::endl;
                //} else {
                //    std::cout << "Inertial stiffness matrix is NOT skew symmetric" << std::endl;
                //}
            }

            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
                // H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) *
                // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by
                // construction
                H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
                H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
                // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) *
                // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by
                // construction
            }
        }
    } else
        H.setZero();

    //
    // The M mass matrix of this element:
    //

    if (Mfactor) {
        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        // ChMatrixNM<double, 12, 12> sectional_mass = this->M;  // it could be consistent mass matrix, depends on
        // SetLumpedMassMatrix(true/false)

        if (this->tapered_section->GetLumpedMassMatrixType()) {
            double node_multiplier_fact = 0.5 * this->length * Mfactor;
            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                // hence it can be the simple (constant) expression
                //   Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
                // but the more general case needs the rotations, hence:
                Mloc.block<3, 3>(stride, stride) += this->M.block<3, 3>(stride, stride) * node_multiplier_fact;
                Mloc.block<3, 3>(stride + 3, stride + 3) +=
                    this->M.block<3, 3>(stride + 3, stride + 3) * node_multiplier_fact;
                Mxw = nodes[i]->GetA() * this->M.block<3, 3>(stride, stride + 3) * node_multiplier_fact;
                Mloc.block<3, 3>(stride, stride + 3) += Mxw;
                Mloc.block<3, 3>(stride + 3, stride) += Mxw.transpose();
            }
            // ..rather do this because lumped mass matrix does not need rotation transf.
            H.block(0, 0, 12, 12) += Mloc;

        } else {
            Mloc = this->M * Mfactor;

            // The following would be needed if consistent mass matrix is used, but...
            ChMatrix33<> Atoabs(this->q_element_abs_rot);
            ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            std::vector<ChMatrix33<>*> R;
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelA);
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelB);

            ChMatrixNM<double, 12, 12> CK;
            ChMatrixNM<double, 12, 12> CKCt;
            ChMatrixCorotation::ComputeCK(Mloc, R, 4, CK);
            ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

            H.block(0, 0, 12, 12) += CKCt;
        }

        //// TODO better per-node lumping, or 4x4 consistent mass matrices, maybe with integration if not uniform
        // materials.
    }
}